

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# registry-inl.h
# Opt level: O2

void __thiscall spdlog::details::registry::set_level(registry *this,level_enum log_level)

{
  __node_base *p_Var1;
  
  std::mutex::lock(&this->logger_map_mutex_);
  p_Var1 = &(this->loggers_)._M_h._M_before_begin;
  while (p_Var1 = p_Var1->_M_nxt, p_Var1 != (__node_base *)0x0) {
    LOCK();
    *(level_enum *)&p_Var1[5]._M_nxt[8]._M_nxt = log_level;
    UNLOCK();
  }
  this->global_log_level_ = log_level;
  pthread_mutex_unlock((pthread_mutex_t *)this);
  return;
}

Assistant:

SPDLOG_INLINE void registry::set_level(level::level_enum log_level) {
    std::lock_guard<std::mutex> lock(logger_map_mutex_);
    for (auto &l : loggers_) {
        l.second->set_level(log_level);
    }
    global_log_level_ = log_level;
}